

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACLoader.cpp
# Opt level: O1

void __thiscall
Assimp::AC3DImporter::InternReadFile
          (AC3DImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  byte bVar3;
  pointer paVar4;
  pointer pcVar5;
  bool bVar6;
  undefined8 uVar7;
  IOStream *pIVar8;
  pointer __src;
  pointer __src_00;
  pointer __src_01;
  pointer pcVar9;
  bool bVar10;
  int iVar11;
  uint uVar12;
  undefined4 extraout_var;
  Logger *pLVar13;
  size_t sVar14;
  pointer this_00;
  aiNode *paVar15;
  aiMesh **__dest;
  aiMaterial **__dest_00;
  aiLight **__dest_01;
  long *plVar16;
  runtime_error *prVar17;
  undefined1 check_comma;
  int iVar18;
  ai_real *paVar19;
  int iVar20;
  uint i;
  char *pcVar21;
  byte *pbVar22;
  byte *pbVar23;
  long lVar24;
  uint uVar25;
  char *pcVar26;
  Assimp *pAVar27;
  ulong uVar28;
  uint i_1;
  ulong uVar29;
  char msg [3];
  vector<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_> materials;
  vector<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_> rootObjects;
  vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> omaterials;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> meshes;
  vector<aiLight_*,_std::allocator<aiLight_*>_> lights;
  vector<char,_std::allocator<char>_> mBuffer2;
  char local_27b;
  char local_27a [2];
  undefined1 local_278 [40];
  IOStream *local_250;
  vector<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_> local_248;
  vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> local_228;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> local_208;
  vector<aiLight_*,_std::allocator<aiLight_*>_> local_1e8;
  vector<char,_std::allocator<char>_> local_1c8;
  undefined1 local_1a8 [8];
  ai_real local_1a0;
  ai_real aStack_19c;
  ai_real aStack_198;
  ai_real aStack_194;
  ai_real aStack_190;
  ai_real local_18c;
  ai_real aStack_188;
  undefined1 local_184 [16];
  float local_174;
  _Alloc_hider local_170;
  size_type local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160 [2];
  ios_base local_138 [264];
  
  local_1a8 = (undefined1  [8])&aStack_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"rb","");
  iVar11 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,(pFile->_M_dataplus)._M_p,local_1a8);
  local_250 = (IOStream *)CONCAT44(extraout_var,iVar11);
  if (local_1a8 != (undefined1  [8])&aStack_198) {
    operator_delete((void *)local_1a8,CONCAT44(aStack_194,aStack_198) + 1);
  }
  if (local_250 == (IOStream *)0x0) {
    prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278,
                   "Failed to open AC3D file ",pFile);
    plVar16 = (long *)std::__cxx11::string::append(local_278);
    local_1a8 = (undefined1  [8])*plVar16;
    paVar19 = (ai_real *)(plVar16 + 2);
    if (local_1a8 == (undefined1  [8])paVar19) {
      aStack_198 = (ai_real)*(long *)paVar19;
      aStack_194 = (ai_real)((ulong)*(long *)paVar19 >> 0x20);
      aStack_190 = (ai_real)plVar16[3];
      local_18c = (ai_real)((ulong)plVar16[3] >> 0x20);
      local_1a8 = (undefined1  [8])&aStack_198;
    }
    else {
      aStack_198 = (ai_real)*(long *)paVar19;
      aStack_194 = (ai_real)((ulong)*(long *)paVar19 >> 0x20);
    }
    local_1a0 = (ai_real)plVar16[1];
    aStack_19c = (ai_real)((ulong)plVar16[1] >> 0x20);
    *plVar16 = (long)paVar19;
    plVar16[1] = 0;
    *(undefined1 *)(plVar16 + 2) = 0;
    std::runtime_error::runtime_error(prVar17,(string *)local_1a8);
    *(undefined ***)prVar17 = &PTR__runtime_error_008e3168;
    __cxa_throw(prVar17,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (char *)0x0;
  local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  BaseImporter::TextFileToBuffer(local_250,&local_1c8,FORBID_EMPTY);
  pcVar9 = local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
           ._M_start;
  this->buffer = local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
  this->mNumMeshes = 0;
  this->lights = 0;
  this->groups = 0;
  this->polys = 0;
  this->worlds = 0;
  iVar11 = strncmp(local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start,"AC3D",4);
  if (iVar11 != 0) {
    prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_1a8 = (undefined1  [8])&aStack_198;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"AC3D: No valid AC3D file, magic sequence not found","");
    std::runtime_error::runtime_error(prVar17,(string *)local_1a8);
    *(undefined ***)prVar17 = &PTR__runtime_error_008e3168;
    __cxa_throw(prVar17,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  cVar2 = pcVar9[4];
  iVar11 = (int)cVar2;
  if ((byte)(cVar2 - 0x30U) < 10) {
    iVar18 = iVar11 + -0x30;
  }
  else if ((byte)(cVar2 + 0x9fU) < 6) {
    iVar18 = iVar11 + -0x57;
  }
  else {
    iVar18 = -1;
    if ((byte)(cVar2 + 0xbfU) < 6) {
      iVar18 = iVar11 + -0x37;
    }
  }
  if (iVar18 < 0) {
    pcVar26 = local_27a;
    local_27b = '-';
    iVar18 = -iVar18;
    uVar25 = 2;
  }
  else {
    pcVar26 = &local_27b;
    uVar25 = 1;
  }
  iVar11 = 1000000000;
  bVar10 = false;
  do {
    if (2 < uVar25) break;
    iVar20 = iVar18 % iVar11;
    if (((bVar10) || (iVar11 == 1)) || ((int)((long)iVar18 / (long)iVar11) != 0)) {
      pcVar21 = pcVar26 + 1;
      uVar25 = uVar25 + 1;
      *pcVar26 = (char)((long)iVar18 / (long)iVar11) + '0';
      bVar10 = true;
      pcVar26 = pcVar21;
      iVar18 = iVar20;
      if (iVar11 != 1) goto LAB_003e0a61;
      bVar6 = false;
      iVar11 = 1;
    }
    else {
LAB_003e0a61:
      iVar11 = iVar11 / 10;
      bVar6 = true;
    }
  } while (bVar6);
  *pcVar26 = '\0';
  pLVar13 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[27]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
             (char (*) [27])"AC3D file format version: ");
  sVar14 = strlen(&local_27b);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_27b,sVar14);
  std::__cxx11::stringbuf::str();
  Logger::info(pLVar13,(char *)local_278._0_8_);
  if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
    operator_delete((void *)local_278._0_8_,(ulong)(local_278._16_8_ + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  local_278._0_8_ = (pointer)0x0;
  local_278._8_8_ = (pointer)0x0;
  local_278._16_8_ = (pointer)0x0;
  std::vector<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_>::
  reserve((vector<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_> *
          )local_278,5);
  local_248.
  super__Vector_base<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>.
  _M_impl.super__Vector_impl_data._M_start = (Object *)0x0;
  local_248.
  super__Vector_base<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>.
  _M_impl.super__Vector_impl_data._M_finish = (Object *)0x0;
  local_248.
  super__Vector_base<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>::reserve
            (&local_248,5);
  local_1e8.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->mLights = &local_1e8;
  bVar10 = GetNextLine(this);
  if (bVar10) {
    do {
      pcVar26 = this->buffer;
      iVar11 = strncmp("MATERIAL",pcVar26,8);
      if (iVar11 == 0) {
        bVar3 = pcVar26[8];
        if ((0x20 < (ulong)bVar3) || ((0x100003601U >> ((ulong)bVar3 & 0x3f) & 1) == 0))
        goto LAB_003e0bb9;
        pcVar21 = pcVar26 + 9;
        if (bVar3 == 0) {
          pcVar21 = pcVar26 + 8;
        }
        this->buffer = pcVar21;
        local_1a8 = (undefined1  [8])0x3f19999a3f19999a;
        local_1a0 = 0.6;
        uVar29 = 0;
        local_18c = 0.0;
        aStack_188 = 0.0;
        aStack_19c = 0.0;
        aStack_198 = 0.0;
        aStack_194 = 0.0;
        aStack_190 = 0.0;
        local_184._0_4_ = 1.0;
        local_184._4_4_ = 1.0;
        local_184._8_8_ = 0x3f800000;
        local_174 = 0.0;
        local_168 = 0;
        local_160[0]._M_local_buf[0] = '\0';
        local_170._M_p = (pointer)local_160;
        std::vector<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_>
        ::emplace_back<Assimp::AC3DImporter::Material>
                  ((vector<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_>
                    *)local_278,(Material *)local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_p != local_160) {
          operator_delete(local_170._M_p,
                          CONCAT71(local_160[0]._M_allocated_capacity._1_7_,
                                   local_160[0]._M_local_buf[0]) + 1);
        }
        uVar7 = local_278._8_8_;
        uVar25 = ~(uint)this->buffer;
        pbVar23 = (byte *)this->buffer;
        while( true ) {
          pbVar22 = pbVar23 + 1;
          if ((*pbVar23 != 0x20) && (*pbVar23 != 9)) break;
          uVar25 = uVar25 - 1;
          pbVar23 = pbVar22;
        }
        this->buffer = (char *)pbVar23;
        uVar28 = (ulong)*pbVar23;
        if (uVar28 < 0x23) {
          uVar29 = 0x3401;
          if ((0x3401UL >> (uVar28 & 0x3f) & 1) != 0) goto LAB_003e0d9d;
          pbVar23 = pbVar22;
          if (uVar28 != 0x22) goto LAB_003e0d68;
LAB_003e0ce7:
          this->buffer = (char *)pbVar23;
          uVar29 = (ulong)*pbVar23;
          if (0x22 < uVar29) {
LAB_003e0d05:
            pbVar23 = pbVar23 + 1;
            goto LAB_003e0ce7;
          }
          if ((0x3401UL >> (uVar29 & 0x3f) & 1) == 0) {
            if (uVar29 == 0x22) goto LAB_003e0d3f;
            goto LAB_003e0d05;
          }
          pLVar13 = DefaultLogger::get();
          Logger::error(pLVar13,"AC3D: Unexpected EOF/EOL in string");
          std::__cxx11::string::_M_replace
                    ((ulong)&((pointer)(uVar7 + -0x58))->name,0,
                     (char *)(((pointer)(uVar7 + -0x58))->name)._M_string_length,0x760f6c);
LAB_003e0d3f:
          uVar12 = (uint)(byte)*this->buffer;
          if ((uVar12 < 0xe) && (uVar29 = 0x3401, (0x3401U >> (uVar12 & 0x1f) & 1) != 0)) {
LAB_003e0d5d:
            bVar10 = false;
            bVar6 = true;
          }
          else {
            local_1a8 = (undefined1  [8])&aStack_198;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1a8,pbVar22,pbVar22 + ((int)this->buffer + uVar25));
            std::__cxx11::string::operator=
                      ((string *)&((pointer)(uVar7 + -0x58))->name,(string *)local_1a8);
            if (local_1a8 != (undefined1  [8])&aStack_198) {
              operator_delete((void *)local_1a8,CONCAT44(aStack_194,aStack_198) + 1);
            }
            pbVar23 = (byte *)(this->buffer + 1);
            this->buffer = (char *)pbVar23;
            for (; (*pbVar23 == 0x20 || (*pbVar23 == 9)); pbVar23 = pbVar23 + 1) {
            }
            this->buffer = (char *)pbVar23;
            bVar3 = *pbVar23;
            uVar29 = (ulong)bVar3;
            bVar10 = true;
            bVar6 = false;
            if ((bVar3 < 0xe) && (bVar6 = false, (0x3401U >> (bVar3 & 0x1f) & 1) != 0)) {
              pLVar13 = DefaultLogger::get();
              Logger::error(pLVar13,"AC3D: Unexpected EOF/EOL");
              goto LAB_003e0d5d;
            }
          }
          if (bVar10) goto LAB_003e0d68;
        }
        else {
LAB_003e0d68:
          for (pbVar23 = (byte *)this->buffer; (*pbVar23 == 0x20 || (*pbVar23 == 9));
              pbVar23 = pbVar23 + 1) {
          }
          this->buffer = (char *)pbVar23;
          if ((*pbVar23 < 0xe) && (uVar29 = 0x3401, (0x3401U >> (*pbVar23 & 0x1f) & 1) != 0)) {
LAB_003e0d9d:
            pLVar13 = DefaultLogger::get();
            pcVar26 = "AC3D: Unexpected EOF/EOL";
          }
          else {
            iVar11 = strncmp((char *)pbVar23,"rgb",3);
            if ((iVar11 == 0) && ((pbVar23[3] == 9 || (pbVar23[3] == 0x20)))) {
              this->buffer = (char *)(pbVar23 + 4);
              lVar24 = 0;
              do {
                for (pAVar27 = (Assimp *)this->buffer;
                    (*pAVar27 == (Assimp)0x20 || (*pAVar27 == (Assimp)0x9)); pAVar27 = pAVar27 + 1)
                {
                }
                this->buffer = (char *)pAVar27;
                if (((byte)*pAVar27 < 0xe) &&
                   (uVar29 = 0x3401, (0x3401U >> ((byte)*pAVar27 & 0x1f) & 1) != 0)) {
                  pLVar13 = DefaultLogger::get();
                  Logger::error(pLVar13,"AC3D: Unexpected EOF/EOL");
                }
                else {
                  pcVar26 = fast_atoreal_move<float>
                                      (pAVar27,(char *)(&(((pointer)(uVar7 + -0x58))->rgb).r +
                                                       lVar24),(float *)0x1,SUB81(uVar29,0));
                  this->buffer = pcVar26;
                }
                lVar24 = lVar24 + 1;
              } while (lVar24 != 3);
              for (pbVar23 = (byte *)this->buffer; (*pbVar23 == 0x20 || (*pbVar23 == 9));
                  pbVar23 = pbVar23 + 1) {
              }
              this->buffer = (char *)pbVar23;
              if ((*pbVar23 < 0xe) && (uVar29 = 0x3401, (0x3401U >> (*pbVar23 & 0x1f) & 1) != 0))
              goto LAB_003e0d9d;
              iVar11 = strncmp((char *)pbVar23,"amb",3);
              if ((iVar11 == 0) && ((pbVar23[3] == 9 || (pbVar23[3] == 0x20)))) {
                this->buffer = (char *)(pbVar23 + 4);
                lVar24 = 0;
                do {
                  for (pAVar27 = (Assimp *)this->buffer;
                      (*pAVar27 == (Assimp)0x20 || (*pAVar27 == (Assimp)0x9)); pAVar27 = pAVar27 + 1
                      ) {
                  }
                  this->buffer = (char *)pAVar27;
                  if (((byte)*pAVar27 < 0xe) &&
                     (uVar29 = 0x3401, (0x3401U >> ((byte)*pAVar27 & 0x1f) & 1) != 0)) {
                    pLVar13 = DefaultLogger::get();
                    Logger::error(pLVar13,"AC3D: Unexpected EOF/EOL");
                  }
                  else {
                    pcVar26 = fast_atoreal_move<float>
                                        (pAVar27,(char *)(uVar7 + lVar24 * 4 + -0x4c),(float *)0x1,
                                         SUB81(uVar29,0));
                    this->buffer = pcVar26;
                  }
                  lVar24 = lVar24 + 1;
                } while (lVar24 != 3);
                for (pbVar23 = (byte *)this->buffer; (*pbVar23 == 0x20 || (*pbVar23 == 9));
                    pbVar23 = pbVar23 + 1) {
                }
                this->buffer = (char *)pbVar23;
                if ((*pbVar23 < 0xe) && (uVar29 = 0x3401, (0x3401U >> (*pbVar23 & 0x1f) & 1) != 0))
                goto LAB_003e0d9d;
                iVar11 = strncmp((char *)pbVar23,"emis",4);
                if ((iVar11 == 0) && ((pbVar23[4] == 9 || (pbVar23[4] == 0x20)))) {
                  this->buffer = (char *)(pbVar23 + 5);
                  lVar24 = 0;
                  do {
                    for (pAVar27 = (Assimp *)this->buffer;
                        (*pAVar27 == (Assimp)0x20 || (*pAVar27 == (Assimp)0x9));
                        pAVar27 = pAVar27 + 1) {
                    }
                    this->buffer = (char *)pAVar27;
                    if (((byte)*pAVar27 < 0xe) &&
                       (uVar29 = 0x3401, (0x3401U >> ((byte)*pAVar27 & 0x1f) & 1) != 0)) {
                      pLVar13 = DefaultLogger::get();
                      Logger::error(pLVar13,"AC3D: Unexpected EOF/EOL");
                    }
                    else {
                      pcVar26 = fast_atoreal_move<float>
                                          (pAVar27,(char *)(uVar7 + lVar24 * 4 + -0x40),(float *)0x1
                                           ,SUB81(uVar29,0));
                      this->buffer = pcVar26;
                    }
                    lVar24 = lVar24 + 1;
                  } while (lVar24 != 3);
                  for (pbVar23 = (byte *)this->buffer; (*pbVar23 == 0x20 || (*pbVar23 == 9));
                      pbVar23 = pbVar23 + 1) {
                  }
                  this->buffer = (char *)pbVar23;
                  if ((*pbVar23 < 0xe) && (uVar29 = 0x3401, (0x3401U >> (*pbVar23 & 0x1f) & 1) != 0)
                     ) goto LAB_003e0d9d;
                  iVar11 = strncmp((char *)pbVar23,"spec",4);
                  if ((iVar11 == 0) && ((pbVar23[4] == 9 || (pbVar23[4] == 0x20)))) {
                    this->buffer = (char *)(pbVar23 + 5);
                    lVar24 = 0;
                    do {
                      for (pAVar27 = (Assimp *)this->buffer;
                          (*pAVar27 == (Assimp)0x20 || (*pAVar27 == (Assimp)0x9));
                          pAVar27 = pAVar27 + 1) {
                      }
                      this->buffer = (char *)pAVar27;
                      if (((byte)*pAVar27 < 0xe) &&
                         (uVar29 = 0x3401, (0x3401U >> ((byte)*pAVar27 & 0x1f) & 1) != 0)) {
                        pLVar13 = DefaultLogger::get();
                        Logger::error(pLVar13,"AC3D: Unexpected EOF/EOL");
                      }
                      else {
                        pcVar26 = fast_atoreal_move<float>
                                            (pAVar27,(char *)(uVar7 + lVar24 * 4 + -0x34),
                                             (float *)0x1,SUB81(uVar29,0));
                        this->buffer = pcVar26;
                      }
                      check_comma = (undefined1)uVar29;
                      lVar24 = lVar24 + 1;
                    } while (lVar24 != 3);
                    for (pbVar23 = (byte *)this->buffer; (*pbVar23 == 0x20 || (*pbVar23 == 9));
                        pbVar23 = pbVar23 + 1) {
                    }
                    this->buffer = (char *)pbVar23;
                    if ((*pbVar23 < 0xe) &&
                       (check_comma = 1, (0x3401U >> (*pbVar23 & 0x1f) & 1) != 0))
                    goto LAB_003e0d9d;
                    iVar11 = strncmp((char *)pbVar23,"shi",3);
                    if ((iVar11 == 0) && ((pbVar23[3] == 9 || (pbVar23[3] == 0x20)))) {
                      pAVar27 = (Assimp *)(pbVar23 + 4);
                      this->buffer = (char *)pAVar27;
                      for (; (*pAVar27 == (Assimp)0x20 || (*pAVar27 == (Assimp)0x9));
                          pAVar27 = pAVar27 + 1) {
                      }
                      this->buffer = (char *)pAVar27;
                      if (((byte)*pAVar27 < 0xe) &&
                         (check_comma = true, (0x3401U >> ((byte)*pAVar27 & 0x1f) & 1) != 0)) {
                        pLVar13 = DefaultLogger::get();
                        Logger::error(pLVar13,"AC3D: Unexpected EOF/EOL");
                      }
                      else {
                        pcVar26 = fast_atoreal_move<float>
                                            (pAVar27,(char *)&((pointer)(uVar7 + -0x58))->shin,
                                             (float *)0x1,(bool)check_comma);
                        this->buffer = pcVar26;
                      }
                      for (pbVar23 = (byte *)this->buffer; (*pbVar23 == 0x20 || (*pbVar23 == 9));
                          pbVar23 = pbVar23 + 1) {
                      }
                      this->buffer = (char *)pbVar23;
                      if ((*pbVar23 < 0xe) &&
                         (check_comma = 1, (0x3401U >> (*pbVar23 & 0x1f) & 1) != 0))
                      goto LAB_003e0d9d;
                      iVar11 = strncmp((char *)pbVar23,"trans",5);
                      if ((iVar11 == 0) && ((pbVar23[5] == 9 || (pbVar23[5] == 0x20)))) {
                        pAVar27 = (Assimp *)(pbVar23 + 6);
                        this->buffer = (char *)pAVar27;
                        for (; (*pAVar27 == (Assimp)0x20 || (*pAVar27 == (Assimp)0x9));
                            pAVar27 = pAVar27 + 1) {
                        }
                        this->buffer = (char *)pAVar27;
                        if (((byte)*pAVar27 < 0xe) &&
                           (check_comma = true, (0x3401U >> ((byte)*pAVar27 & 0x1f) & 1) != 0)) {
                          pLVar13 = DefaultLogger::get();
                          bVar6 = false;
                          Logger::error(pLVar13,"AC3D: Unexpected EOF/EOL");
                        }
                        else {
                          pcVar26 = fast_atoreal_move<float>
                                              (pAVar27,(char *)&((pointer)(uVar7 + -0x58))->trans,
                                               (float *)0x1,(bool)check_comma);
                          this->buffer = pcVar26;
                          bVar6 = false;
                        }
                        goto LAB_003e0db6;
                      }
                      pLVar13 = DefaultLogger::get();
                      pcVar26 = "AC3D: Unexpexted token. trans was expected.";
                    }
                    else {
                      pLVar13 = DefaultLogger::get();
                      pcVar26 = "AC3D: Unexpexted token. shi was expected.";
                    }
                  }
                  else {
                    pLVar13 = DefaultLogger::get();
                    pcVar26 = "AC3D: Unexpexted token. spec was expected.";
                  }
                }
                else {
                  pLVar13 = DefaultLogger::get();
                  pcVar26 = "AC3D: Unexpexted token. emis was expected.";
                }
              }
              else {
                pLVar13 = DefaultLogger::get();
                pcVar26 = "AC3D: Unexpexted token. amb was expected.";
              }
            }
            else {
              pLVar13 = DefaultLogger::get();
              pcVar26 = "AC3D: Unexpexted token. rgb was expected.";
            }
          }
          bVar6 = true;
          Logger::error(pLVar13,pcVar26);
        }
LAB_003e0db6:
        if (!bVar6) goto LAB_003e0bb9;
      }
      else {
LAB_003e0bb9:
        LoadObjectSection(this,&local_248);
      }
      bVar10 = GetNextLine(this);
    } while (bVar10);
  }
  if ((local_248.
       super__Vector_base<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       local_248.
       super__Vector_base<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>
       ._M_impl.super__Vector_impl_data._M_finish) || (this->mNumMeshes == 0)) {
    prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_1a8 = (undefined1  [8])&aStack_198;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"AC3D: No meshes have been loaded","");
    std::runtime_error::runtime_error(prVar17,(string *)local_1a8);
    *(undefined ***)prVar17 = &PTR__runtime_error_008e3168;
    __cxa_throw(prVar17,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_278._0_8_ == local_278._8_8_) {
    pLVar13 = DefaultLogger::get();
    Logger::warn(pLVar13,"AC3D: No material has been found");
    local_1a8 = (undefined1  [8])0x3f19999a3f19999a;
    local_1a0 = 0.6;
    aStack_19c = 0.0;
    aStack_198 = 0.0;
    aStack_194 = 0.0;
    aStack_190 = 0.0;
    local_18c = 0.0;
    aStack_188 = 0.0;
    local_184._0_4_ = 1.0;
    local_184._4_4_ = 1.0;
    local_184._8_8_ = 0x3f800000;
    local_174 = 0.0;
    local_168 = 0;
    local_160[0]._M_local_buf[0] = '\0';
    local_170._M_p = (pointer)local_160;
    std::vector<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_>::
    emplace_back<Assimp::AC3DImporter::Material>
              ((vector<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_>
                *)local_278,(Material *)local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_p != local_160) {
      operator_delete(local_170._M_p,
                      CONCAT71(local_160[0]._M_allocated_capacity._1_7_,local_160[0]._M_local_buf[0]
                              ) + 1);
    }
  }
  uVar25 = this->mNumMeshes + (this->mNumMeshes >> 2) + 1;
  this->mNumMeshes = uVar25;
  local_208.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_208.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_208.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::reserve(&local_208,(ulong)uVar25);
  local_228.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_228.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_228.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_>::
  reserve((vector<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_> *
          )local_278,(ulong)this->mNumMeshes);
  this_00 = local_248.
            super__Vector_base<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((long)local_248.
            super__Vector_base<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_248.
            super__Vector_base<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>
            ._M_impl.super__Vector_impl_data._M_start != 0xe0) {
    this_00 = (pointer)operator_new(0xe0);
    Object::Object(this_00);
  }
  paVar15 = ConvertObjectSection
                      (this,this_00,&local_208,&local_228,
                       (vector<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_>
                        *)local_278,(aiNode *)0x0);
  pScene->mRootNode = paVar15;
  if ((long)local_248.
            super__Vector_base<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_248.
            super__Vector_base<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>
            ._M_impl.super__Vector_impl_data._M_start != 0xe0) {
    std::vector<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>::
    ~vector(&this_00->surfaces);
    paVar4 = (this_00->vertices).
             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (paVar4 != (pointer)0x0) {
      operator_delete(paVar4,(long)(this_00->vertices).
                                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)paVar4
                     );
    }
    pcVar5 = (this_00->texture)._M_dataplus._M_p;
    paVar1 = &(this_00->texture).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar5 != paVar1) {
      operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
    }
    std::vector<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>::
    ~vector(&this_00->children);
    pcVar5 = (this_00->name)._M_dataplus._M_p;
    paVar1 = &(this_00->name).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar5 != paVar1) {
      operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
    }
    operator_delete(this_00,0xe0);
  }
  paVar15 = pScene->mRootNode;
  pcVar26 = (paVar15->mName).data;
  iVar11 = strncmp(pcVar26,"Node",4);
  __src_00 = local_208.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (iVar11 == 0) {
    (paVar15->mName).length = 0xb;
    builtin_strncpy(pcVar26,"<AC3DWorld>",0xc);
  }
  if (local_208.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_208.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_1a8 = (undefined1  [8])&aStack_198;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"An unknown error occurred during converting","");
    std::runtime_error::runtime_error(prVar17,(string *)local_1a8);
    *(undefined ***)prVar17 = &PTR__runtime_error_008e3168;
    __cxa_throw(prVar17,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  pScene->mNumMeshes =
       (uint)((ulong)((long)local_208.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)local_208.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl
                           .super__Vector_impl_data._M_start) >> 3);
  uVar29 = (long)local_208.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_208.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                 super__Vector_impl_data._M_start & 0x7fffffff8;
  __dest = (aiMesh **)operator_new__(uVar29);
  pScene->mMeshes = __dest;
  memcpy(__dest,__src_00,uVar29);
  __src = local_228.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
          super__Vector_impl_data._M_start;
  pScene->mNumMaterials =
       (uint)((ulong)((long)local_228.
                            super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)local_228.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 3);
  uVar29 = (long)local_228.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_228.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                 super__Vector_impl_data._M_start & 0x7fffffff8;
  __dest_00 = (aiMaterial **)operator_new__(uVar29);
  pScene->mMaterials = __dest_00;
  memcpy(__dest_00,__src,uVar29);
  __src_01 = local_1e8.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  uVar29 = (long)local_1e8.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_1e8.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  pScene->mNumLights = (uint)uVar29;
  uVar28 = (long)local_1e8.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_1e8.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
  if (uVar28 != 0) {
    __dest_01 = (aiLight **)operator_new__(-(ulong)(uVar29 >> 0x3d != 0) | uVar28);
    pScene->mLights = __dest_01;
    memcpy(__dest_01,__src_01,uVar28);
  }
  if (__src != (pointer)0x0) {
    operator_delete(__src,(long)local_228.
                                super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage - (long)__src);
  }
  pIVar8 = local_250;
  if (local_208.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_208.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_208.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_208.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1e8.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e8.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1e8.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e8.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>::~vector
            (&local_248);
  std::vector<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_>::
  ~vector((vector<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_> *
          )local_278);
  if (local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (char *)0x0) {
    operator_delete(local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  (*pIVar8->_vptr_IOStream[1])(pIVar8);
  return;
}

Assistant:

void AC3DImporter::InternReadFile( const std::string& pFile,
    aiScene* pScene, IOSystem* pIOHandler)
{
    std::unique_ptr<IOStream> file( pIOHandler->Open( pFile, "rb"));

    // Check whether we can read from the file
    if( file.get() == NULL)
        throw DeadlyImportError( "Failed to open AC3D file " + pFile + ".");

    // allocate storage and copy the contents of the file to a memory buffer
    std::vector<char> mBuffer2;
    TextFileToBuffer(file.get(),mBuffer2);

    buffer = &mBuffer2[0];
    mNumMeshes = 0;

    lights = polys = worlds = groups = 0;

    if (::strncmp(buffer,"AC3D",4)) {
        throw DeadlyImportError("AC3D: No valid AC3D file, magic sequence not found");
    }

    // print the file format version to the console
    unsigned int version = HexDigitToDecimal( buffer[4] );
    char msg[3];
    ASSIMP_itoa10(msg,3,version);
    ASSIMP_LOG_INFO_F("AC3D file format version: ", msg);

    std::vector<Material> materials;
    materials.reserve(5);

    std::vector<Object> rootObjects;
    rootObjects.reserve(5);

    std::vector<aiLight*> lights;
    mLights = & lights;

    while (GetNextLine())
    {
        if (TokenMatch(buffer,"MATERIAL",8))
        {
            materials.push_back(Material());
            Material& mat = materials.back();

            // manually parse the material ... sscanf would use the buldin atof ...
            // Format: (name) rgb %f %f %f  amb %f %f %f  emis %f %f %f  spec %f %f %f  shi %d  trans %f

            AI_AC_SKIP_TO_NEXT_TOKEN();
            if ('\"' == *buffer)
            {
                AI_AC_GET_STRING(mat.name);
                AI_AC_SKIP_TO_NEXT_TOKEN();
            }

            AI_AC_CHECKED_LOAD_FLOAT_ARRAY("rgb",3,3,&mat.rgb);
            AI_AC_CHECKED_LOAD_FLOAT_ARRAY("amb",3,3,&mat.amb);
            AI_AC_CHECKED_LOAD_FLOAT_ARRAY("emis",4,3,&mat.emis);
            AI_AC_CHECKED_LOAD_FLOAT_ARRAY("spec",4,3,&mat.spec);
            AI_AC_CHECKED_LOAD_FLOAT_ARRAY("shi",3,1,&mat.shin);
            AI_AC_CHECKED_LOAD_FLOAT_ARRAY("trans",5,1,&mat.trans);
        }
        LoadObjectSection(rootObjects);
    }

    if (rootObjects.empty() || !mNumMeshes)
    {
        throw DeadlyImportError("AC3D: No meshes have been loaded");
    }
    if (materials.empty())
    {
        ASSIMP_LOG_WARN("AC3D: No material has been found");
        materials.push_back(Material());
    }

    mNumMeshes += (mNumMeshes>>2u) + 1;
    std::vector<aiMesh*> meshes;
    meshes.reserve(mNumMeshes);

    std::vector<aiMaterial*> omaterials;
    materials.reserve(mNumMeshes);

    // generate a dummy root if there are multiple objects on the top layer
    Object* root;
    if (1 == rootObjects.size())
        root = &rootObjects[0];
    else
    {
        root = new Object();
    }

    // now convert the imported stuff to our output data structure
    pScene->mRootNode = ConvertObjectSection(*root,meshes,omaterials,materials);
    if (1 != rootObjects.size())delete root;

    if (!::strncmp( pScene->mRootNode->mName.data, "Node", 4))
        pScene->mRootNode->mName.Set("<AC3DWorld>");

    // copy meshes
    if (meshes.empty())
    {
        throw DeadlyImportError("An unknown error occurred during converting");
    }
    pScene->mNumMeshes = (unsigned int)meshes.size();
    pScene->mMeshes = new aiMesh*[pScene->mNumMeshes];
    ::memcpy(pScene->mMeshes,&meshes[0],pScene->mNumMeshes*sizeof(void*));

    // copy materials
    pScene->mNumMaterials = (unsigned int)omaterials.size();
    pScene->mMaterials = new aiMaterial*[pScene->mNumMaterials];
    ::memcpy(pScene->mMaterials,&omaterials[0],pScene->mNumMaterials*sizeof(void*));

    // copy lights
    pScene->mNumLights = (unsigned int)lights.size();
    if (lights.size())
    {
        pScene->mLights = new aiLight*[lights.size()];
        ::memcpy(pScene->mLights,&lights[0],lights.size()*sizeof(void*));
    }
}